

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::detail::redirect<httplib::Client>
          (detail *this,Client *cli,Request *req,Response *res,string *path)

{
  ssize_t sVar1;
  int __flags;
  Response new_res;
  Request new_req;
  Response local_2f0;
  undefined1 local_230 [32];
  _Alloc_hider local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f0;
  _Alloc_hider local_1c0;
  size_type local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  _Alloc_hider local_1a0;
  size_type local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  _Alloc_hider local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  _Rb_tree_node_base local_158;
  size_t local_138;
  _Rb_tree_node_base local_128;
  size_t local_108;
  pointer ppStack_100;
  pointer local_f8;
  pointer ppStack_f0;
  pointer local_e8;
  pointer psStack_e0;
  pointer local_d8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_d0;
  size_t local_c8;
  _Any_data local_c0;
  _Manager_type local_b0;
  _Invoker_type p_Stack_a8;
  _Any_data local_a0;
  _Manager_type local_90;
  _Invoker_type p_Stack_88;
  _Any_data local_80;
  _Manager_type local_70;
  _Invoker_type p_Stack_68;
  _Any_data local_50;
  _Manager_type local_40;
  _Invoker_type p_Stack_38;
  
  __flags = (int)path;
  local_230._0_8_ = local_230 + 0x10;
  local_230._8_8_ = 0;
  local_230[0x10] = '\0';
  local_210._M_p = (pointer)&local_200;
  local_208 = 0;
  local_200._M_local_buf[0] = '\0';
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1f0._M_impl.super__Rb_tree_header._M_header;
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1c0._M_p = (pointer)&local_1b0;
  local_1b8 = 0;
  local_1b0._M_local_buf[0] = '\0';
  local_1a0._M_p = (pointer)&local_190;
  local_198 = 0;
  local_190._M_local_buf[0] = '\0';
  local_180._M_p = (pointer)&local_170;
  local_178 = 0;
  local_170._M_local_buf[0] = '\0';
  local_158._M_left = &local_158;
  local_158._M_color = _S_red;
  local_158._M_parent = (_Base_ptr)0x0;
  local_138 = 0;
  local_128._M_left = &local_128;
  local_128._M_color = _S_red;
  local_128._M_parent = (_Base_ptr)0x0;
  local_d8 = (pointer)0x0;
  _Stack_d0._M_current = (char *)0x0;
  local_e8 = (pointer)0x0;
  psStack_e0 = (pointer)0x0;
  local_f8 = (pointer)0x0;
  ppStack_f0 = (pointer)0x0;
  local_108 = 0;
  ppStack_100 = (pointer)0x0;
  local_c8 = 0x14;
  local_40 = (_Manager_type)0x0;
  p_Stack_38 = (_Invoker_type)0x0;
  local_50._M_unused._M_object = (void *)0x0;
  local_50._8_8_ = 0;
  local_70 = (_Manager_type)0x0;
  p_Stack_68 = (_Invoker_type)0x0;
  local_80._M_unused._M_object = (void *)0x0;
  local_80._8_8_ = 0;
  local_90 = (_Manager_type)0x0;
  p_Stack_88 = (_Invoker_type)0x0;
  local_a0._M_unused._M_object = (void *)0x0;
  local_a0._8_8_ = 0;
  local_b0 = (_Manager_type)0x0;
  p_Stack_a8 = (_Invoker_type)0x0;
  local_c0._M_unused._M_object = (void *)0x0;
  local_c0._8_8_ = 0;
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1f0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_158._M_right = local_158._M_left;
  local_128._M_right = local_128._M_left;
  std::__cxx11::string::_M_assign((string *)local_230);
  std::__cxx11::string::_M_assign((string *)&local_210);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&local_1f0,
              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&(cli->host_and_port_)._M_string_length);
  std::__cxx11::string::_M_assign((string *)&local_1c0);
  local_c8 = (long)cli[3]._vptr_Client - 1;
  std::function<bool_(const_httplib::Response_&)>::operator=
            ((function<bool_(const_httplib::Response_&)> *)&local_c0,
             (function<bool_(const_httplib::Response_&)> *)&cli[3].host_);
  std::function<bool_(const_char_*,_unsigned_long)>::operator=
            ((function<bool_(const_char_*,_unsigned_long)> *)&local_a0,
             (function<bool_(const_char_*,_unsigned_long)> *)&cli[3].port_);
  std::function<bool_(unsigned_long,_unsigned_long)>::operator=
            ((function<bool_(unsigned_long,_unsigned_long)> *)&local_80,
             (function<bool_(unsigned_long,_unsigned_long)> *)&cli[3].host_and_port_.field_2);
  local_2f0.version._M_dataplus._M_p = (pointer)&local_2f0.version.field_2;
  local_2f0.version._M_string_length = 0;
  local_2f0.version.field_2._M_local_buf[0] = '\0';
  local_2f0.status = -1;
  local_2f0.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2f0.headers._M_t._M_impl.super__Rb_tree_header._M_header;
  local_2f0.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2f0.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2f0.headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2f0.body._M_dataplus._M_p = (pointer)&local_2f0.body.field_2;
  local_2f0.body._M_string_length = 0;
  local_2f0.body.field_2._M_local_buf[0] = '\0';
  local_2f0.content_length = 0;
  local_2f0.content_provider.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_2f0.content_provider.super__Function_base._M_functor._8_8_ = 0;
  local_2f0.content_provider.super__Function_base._M_manager = (_Manager_type)0x0;
  local_2f0.content_provider._M_invoker = (_Invoker_type)0x0;
  local_2f0.content_provider_resource_releaser.super__Function_base._M_functor._M_unused._M_object =
       (void *)0x0;
  local_2f0.content_provider_resource_releaser.super__Function_base._M_functor._8_8_ = 0;
  local_2f0.content_provider_resource_releaser.super__Function_base._M_manager = (_Manager_type)0x0;
  local_2f0.content_provider_resource_releaser._M_invoker = (_Invoker_type)0x0;
  local_2f0.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2f0.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sVar1 = Client::send((Client *)this,(int)local_230,&local_2f0,0,__flags);
  if ((char)sVar1 != '\0') {
    std::__cxx11::string::_M_assign((string *)req);
    *(int *)&(req->path)._M_dataplus._M_p = local_2f0.status;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&(req->path)._M_string_length,&local_2f0.headers._M_t);
    std::__cxx11::string::_M_assign
              ((string *)&(req->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
    (req->body)._M_string_length = local_2f0.content_length;
    std::
    function<void_(unsigned_long,_unsigned_long,_std::function<void_(const_char_*,_unsigned_long)>,_std::function<void_()>)>
    ::operator=((function<void_(unsigned_long,_unsigned_long,_std::function<void_(const_char_*,_unsigned_long)>,_std::function<void_()>)>
                 *)&(req->body).field_2,&local_2f0.content_provider);
    std::function<void_()>::operator=
              ((function<void_()> *)&(req->version).field_2,
               &local_2f0.content_provider_resource_releaser);
  }
  Response::~Response(&local_2f0);
  Request::~Request((Request *)local_230);
  return (bool)(char)sVar1;
}

Assistant:

inline bool redirect(T &cli, const Request &req, Response &res,
                     const std::string &path) {
  Request new_req;
  new_req.method = req.method;
  new_req.path = path;
  new_req.headers = req.headers;
  new_req.body = req.body;
  new_req.redirect_count = req.redirect_count - 1;
  new_req.response_handler = req.response_handler;
  new_req.content_receiver = req.content_receiver;
  new_req.progress = req.progress;

  Response new_res;
  auto ret = cli.send(new_req, new_res);
  if (ret) { res = new_res; }
  return ret;
}